

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

void arrangeQuoters_superFast_moreThen5
               (word *pInOut,word *temp,int start,int iQ,int jQ,int kQ,int lQ,int iVar,
               char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  int iVar2;
  word *local_40;
  word *tempPtr;
  int shiftSize;
  int blockSize;
  int wordBlock;
  int i;
  int kQ_local;
  int jQ_local;
  int iQ_local;
  int start_local;
  word *temp_local;
  word *pInOut_local;
  
  local_40 = temp + start;
  if ((iQ != 0) || (jQ != 1)) {
    iVar1 = 1 << ((char)iVar - 6U & 0x1f);
    iVar2 = iVar1 << 3;
    for (blockSize = start - iVar1; 0 < blockSize; blockSize = blockSize + iVar1 * -4) {
      local_40 = local_40 + -(long)iVar1;
      memcpy(local_40,pInOut + ((long)blockSize - (long)(iQ * iVar1)),(long)iVar2);
      local_40 = local_40 + -(long)iVar1;
      memcpy(local_40,pInOut + ((long)blockSize - (long)(jQ * iVar1)),(long)iVar2);
      memcpy(local_40 + -(long)iVar1,pInOut + ((long)blockSize - (long)(kQ * iVar1)),(long)iVar2);
      local_40 = local_40 + -(long)iVar1 + -(long)iVar1;
      memcpy(local_40,pInOut + ((long)blockSize - (long)(lQ * iVar1)),(long)iVar2);
    }
    memcpy(pInOut,temp,(long)start << 3);
    updataInfo(iQ,jQ,iVar,pCanonPerm,pCanonPhase);
  }
  return;
}

Assistant:

void arrangeQuoters_superFast_moreThen5(word* pInOut, word* temp, int start,  int iQ, int jQ, int kQ, int lQ, int iVar, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i,wordBlock,blockSize,shiftSize;
    word* tempPtr = temp+start;
//     printf("in arrangeQuoters_superFast_moreThen5\n");

    if(iQ == 0 && jQ == 1)
        return;
    wordBlock = (1<<(iVar-6));
    blockSize = wordBlock*sizeof(word);
    shiftSize = wordBlock*4;
    for(i=start-wordBlock;i>0;i-=shiftSize)
    {       
        tempPtr -= wordBlock;       
        memcpy(tempPtr, pInOut+i-iQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-jQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-kQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-lQ*wordBlock, (size_t)blockSize);      
    }   
    memcpy(pInOut, temp, start*sizeof(word));
    updataInfo(iQ, jQ, iVar, pCanonPerm, pCanonPhase);
//    printf("out arrangeQuoters_superFast_moreThen5\n");

}